

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

uint64_t __thiscall llvm::APInt::getZExtValue(APInt *this)

{
  bool bVar1;
  uint uVar2;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    this_local = (APInt *)(this->U).pVal;
  }
  else {
    uVar2 = getActiveBits(this);
    if (0x40 < uVar2) {
      __assert_fail("getActiveBits() <= 64 && \"Too many bits for uint64_t\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                    ,0x617,"uint64_t llvm::APInt::getZExtValue() const");
    }
    this_local = (APInt *)*(this->U).pVal;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t getZExtValue() const {
    if (isSingleWord())
      return U.VAL;
    assert(getActiveBits() <= 64 && "Too many bits for uint64_t");
    return U.pVal[0];
  }